

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

void cmd_set_arg(command_conflict *cmd,char *name,cmd_arg_type type,cmd_arg_data_conflict data)

{
  int iVar1;
  long lVar2;
  char *__s1;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21a,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if (*name == '\0') {
    __assert_fail("name[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21b,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  __s1 = cmd->arg[0].name;
  uVar3 = 0xffffffff;
  lVar2 = 0;
  do {
    uVar4 = (uint)lVar2;
    uVar5 = uVar3;
    if (uVar3 == 0xffffffff) {
      uVar5 = uVar4;
    }
    if (*__s1 != '\0') {
      uVar5 = uVar3;
    }
    uVar3 = uVar5;
    iVar1 = strcmp(__s1,name);
    if (iVar1 == 0) break;
    __s1 = __s1 + 0x28;
    bVar6 = lVar2 != 3;
    lVar2 = lVar2 + 1;
    uVar4 = 0xffffffff;
  } while (bVar6);
  if ((uVar3 & uVar4) != 0xffffffff) {
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    cmd->arg[(int)uVar3].type = type;
    cmd->arg[(int)uVar3].data = data;
    my_strcpy(cmd->arg[(int)uVar3].name,name,0x14);
    return;
  }
  __assert_fail("first_empty != -1 || idx != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                ,0x229,
                "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
               );
}

Assistant:

static void cmd_set_arg(struct command *cmd, const char *name,
						enum cmd_arg_type type, union cmd_arg_data data)
{
	size_t i;

	int first_empty = -1;
	int idx = -1;

	assert(name);
	assert(name[0]);

	/* Find an arg that either... */
	for (i = 0; i < CMD_MAX_ARGS; i++) {
		struct cmd_arg *arg = &cmd->arg[i];
		if (!arg->name[0] && first_empty == -1)
			first_empty = i;

		if (streq(arg->name, name)) {
			idx = i;
			break;
		}
	}

	assert(first_empty != -1 || idx != -1);

	if (idx == -1)
		idx = first_empty;

	cmd->arg[idx].type = type;
	cmd->arg[idx].data = data;
	my_strcpy(cmd->arg[idx].name, name, sizeof cmd->arg[0].name);
}